

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O2

void server::owords_cmd(int cid,char **args,int argc)

{
  int cn;
  size_t sVar1;
  long lVar2;
  char colors [10];
  char owordList [1024];
  
  memcpy(owordList,"Offensive words (words not to say): ",0x400);
  for (lVar2 = 0; lVar2 != 13000; lVar2 = lVar2 + 0x104) {
    if (owords[0][lVar2] != '\0') {
      sprintf(colors,"\f%d",3);
      strcat(owordList,colors);
      strcat(owordList,owords[0] + lVar2);
      sVar1 = strlen(owordList);
      builtin_strncpy(owordList + sVar1,"\f2, ",5);
    }
  }
  sVar1 = strlen(owordList);
  owordList[sVar1 - 2] = '\0';
  cn = QServ::getSender(&qs);
  sendf(cn,1,"ris",0x23,owordList);
  return;
}

Assistant:

QSERV_CALLBACK owords_cmd(p) {
        char owordList[1024] = "Offensive words (words not to say): ";
        char colors[10];

        for(int i = 0; i < 50; i++) {
            if(strlen(owords[i]) > 0) {
                sprintf(colors, "\f%d", 3);
                strcat(owordList, colors);
                strcat(owordList, owords[i]);
                strcat(owordList, "\f2, ");
            }
        }
        owordList[strlen(owordList)-2] = '\0';
        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, owordList);
    }